

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O3

EC_T_BOOL __thiscall
CEmNotification::EnqueueJob
          (CEmNotification *this,PT_SLAVEJOBS pJob,EC_T_DWORD dwCode,void *pSrc,EC_T_DWORD dwSize)

{
  PT_SLAVEJOBS p_Var1;
  PT_SLAVEJOBS p_Var2;
  CAtEmLogging *this_00;
  undefined8 uVar3;
  PT_SLAVEJOBS p_Var4;
  bool bVar5;
  
  p_Var2 = (this->m_oSlaveJobQueue).pWrite;
  p_Var1 = p_Var2 + 1;
  p_Var4 = (this->m_oSlaveJobQueue).Jobs;
  if (p_Var1 <= (this->m_oSlaveJobQueue).Jobs + 0x13) {
    p_Var4 = p_Var1;
  }
  if (p_Var2 == (PT_SLAVEJOBS)0x0) {
    p_Var4 = (PT_SLAVEJOBS)0x0;
  }
  bVar5 = p_Var4 == (this->m_oSlaveJobQueue).pRead;
  if (bVar5) {
    this_00 = this->m_pcLogging;
    uVar3 = ecatGetNotifyText(dwCode);
    CAtEmLogging::LogError
              (this_00,
               "ERROR: Unable to enqueue %s job! Missing calls to ProcessNotificationJobs or queue too small."
               ,uVar3);
  }
  else {
    pJob->dwCode = dwCode;
    memcpy(&pJob->JobData,pSrc,(ulong)dwSize);
    memcpy((this->m_oSlaveJobQueue).pWrite,pJob,0x5ec);
    (this->m_oSlaveJobQueue).pWrite = p_Var4;
  }
  return (uint)!bVar5;
}

Assistant:

EC_T_BOOL CEmNotification::EnqueueJob(
    PT_SLAVEJOBS pJob, 
    EC_T_DWORD dwCode, 
    EC_T_VOID* pSrc, 
    EC_T_DWORD dwSize       
                                     )
{
    EC_T_BOOL    bRet      = EC_FALSE;
    PT_SLAVEJOBS pNewWrite = EC_NULL;

    pNewWrite = IncrementJobPtr(m_oSlaveJobQueue.pWrite);

    if (pNewWrite == m_oSlaveJobQueue.pRead)
    {
        /* no more space in queue */
        goto Exit;
    }

    /* store job */
    pJob->dwCode = dwCode;
    OsMemcpy(&(pJob->JobData), pSrc, dwSize);
    OsMemcpy(m_oSlaveJobQueue.pWrite, pJob, sizeof(T_SLAVEJOBS));

    /* increment write pointer */
    m_oSlaveJobQueue.pWrite = pNewWrite;

    bRet = EC_TRUE;
Exit:
    if (!bRet)
    {
        LogError("ERROR: Unable to enqueue %s job! Missing calls to ProcessNotificationJobs or queue too small.", ecatGetNotifyText(dwCode));
    }

    return bRet;
}